

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fctkern__log_test_end(fctkern_t *nk,fct_test_t *test)

{
  size_t sVar1;
  void *pvVar2;
  size_t idx;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x974
                  ,"void fctkern__log_test_end(fctkern_t *, fct_test_t *)");
  }
  if (test != (fct_test_t *)0x0) {
    sVar1 = (nk->logger_list).used_itm_num;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      pvVar2 = fct_nlist__at(&nk->logger_list,idx);
      *(fct_test_t **)((long)pvVar2 + 0x68) = test;
      (**(code **)((long)pvVar2 + 0x10))(pvVar2,(long)pvVar2 + 0x58);
    }
    return;
  }
  __assert_fail("test != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x975,
                "void fctkern__log_test_end(fctkern_t *, fct_test_t *)");
}

Assistant:

static void
fctkern__log_test_end(fctkern_t *nk, fct_test_t *test)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( test != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_end(logger, test);
    }
    FCT_NLIST_FOREACH_END();
}